

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>,int>
               (View<int,_false,_std::allocator<unsigned_long>_> *v,
               BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
               *expression)

{
  long *plVar1;
  CoordinateOrder CVar2;
  View<int,_true,_std::allocator<unsigned_long>_> *pVVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  unsigned_long uVar7;
  bool bVar8;
  size_t sVar9;
  size_t sVar10;
  runtime_error *prVar11;
  int *piVar12;
  size_t sVar13;
  size_t sVar14;
  int *piVar15;
  pointer puVar16;
  long lVar17;
  ulong uVar18;
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator_type local_a1;
  long local_a0;
  View<int,_true,_std::allocator<unsigned_long>_> *local_98;
  BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *local_90;
  reference local_88;
  size_t local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long local_50;
  long local_48;
  
  if (((v->geometry_).size_ == 0) || ((expression->e_->geometry_).size_ == 0)) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"Assertion failed.");
  }
  else {
    sVar9 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
            ::dimension(expression);
    if (v->data_ == (pointer)0x0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"Assertion failed.");
    }
    else if (sVar9 == (v->geometry_).dimension_) {
      if (sVar9 == 0) {
        if (((v->geometry_).size_ == 1) && ((expression->e_->geometry_).size_ == 1)) {
LAB_00210a06:
          bVar8 = BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>
                  ::overlaps<int,false,std::allocator<unsigned_long>>
                            ((BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>
                              *)expression,v);
          if (bVar8) {
            Marray<int,std::allocator<unsigned_long>>::
            Marray<andres::BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>,int>
                      ((Marray<int,std::allocator<unsigned_long>> *)&local_78,
                       (ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                        *)expression,&local_a1);
            operate<andres::marray_detail::Assign<int,int>,int,int,false,std::allocator<unsigned_long>>
                      (v,&local_78);
            operator_delete((void *)CONCAT44(local_78.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_78.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_),
                            local_48 << 2);
            uVar18 = local_50 * 0x18;
            puVar16 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_00210c5b:
            operator_delete(puVar16,uVar18);
            return;
          }
          if (v->data_ == (int *)0x0) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Assertion failed.");
          }
          else {
            if ((v->geometry_).dimension_ == 0) {
              *v->data_ = *expression->e_->data_ * expression->scalar_;
              return;
            }
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
            if (((v->geometry_).isSimple_ == true) &&
               (pVVar3 = expression->e_,
               View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar3),
               (pVVar3->geometry_).isSimple_ == true)) {
              View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
              CVar2 = (v->geometry_).coordinateOrder_;
              pVVar3 = expression->e_;
              View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar3);
              if (CVar2 == (pVVar3->geometry_).coordinateOrder_) {
                sVar9 = (v->geometry_).size_;
                if (sVar9 == 0) {
                  return;
                }
                piVar4 = v->data_;
                piVar5 = expression->e_->data_;
                sVar10 = 0;
                do {
                  piVar4[sVar10] = piVar5[sVar10] * expression->scalar_;
                  sVar10 = sVar10 + 1;
                } while (sVar9 != sVar10);
                return;
              }
            }
            local_98 = expression->e_;
            local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0;
            local_88 = AccessOperatorHelper<true>::
                       execute<int,int,true,std::allocator<unsigned_long>>
                                 (local_98,(int *)&local_78);
            if (v->data_ != (pointer)0x0) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_78,(v->geometry_).dimension_,(allocator_type *)&local_a1);
              piVar12 = v->data_;
              if (piVar12 == (int *)0x0) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar11,"Assertion failed.");
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              local_80 = (v->geometry_).dimension_ - 1;
              lVar17 = 0;
              local_a0 = 0;
              piVar15 = piVar12;
              local_90 = expression;
              do {
                *piVar12 = local_88[local_a0] * local_90->scalar_;
                if ((v->geometry_).dimension_ != 0) {
                  sVar9 = 0;
                  do {
                    lVar6 = *(long *)(CONCAT44(local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_78.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     sVar9 * 8);
                    sVar10 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,sVar9);
                    if (lVar6 + 1U != sVar10) {
                      sVar10 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,sVar9);
                      sVar13 = View<int,_true,_std::allocator<unsigned_long>_>::strides
                                         (local_98,sVar9);
                      local_a0 = local_a0 + sVar13;
                      lVar17 = lVar17 + sVar10;
                      plVar1 = (long *)(CONCAT44(local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       sVar9 * 8);
                      *plVar1 = *plVar1 + 1;
                      piVar15 = v->data_;
                      break;
                    }
                    puVar16 = (pointer)CONCAT44(local_78.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_78.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
                    if (local_80 == sVar9) {
                      if (puVar16 == (pointer)0x0) {
                        return;
                      }
                      uVar18 = (long)local_78.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar16;
                      goto LAB_00210c5b;
                    }
                    uVar7 = puVar16[sVar9];
                    sVar10 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,sVar9);
                    sVar13 = View<int,_true,_std::allocator<unsigned_long>_>::strides
                                       (local_98,sVar9);
                    sVar14 = View<int,_true,_std::allocator<unsigned_long>_>::shape(local_98,sVar9);
                    *(undefined8 *)
                     (CONCAT44(local_78.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_78.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_) + sVar9 * 8) = 0;
                    piVar15 = v->data_;
                    if (piVar15 == (int *)0x0) {
                      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar11,"Assertion failed.");
                      __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_a0 = local_a0 - (sVar14 - 1) * sVar13;
                    lVar17 = lVar17 - sVar10 * uVar7;
                    sVar9 = sVar9 + 1;
                  } while (sVar9 < (v->geometry_).dimension_);
                }
                piVar12 = piVar15 + lVar17;
              } while( true );
            }
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Assertion failed.");
          }
        }
        else {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"Assertion failed.");
        }
      }
      else {
        uVar18 = 0;
        do {
          if ((v->geometry_).dimension_ <= uVar18) goto LAB_00210a06;
          sVar9 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,uVar18);
          sVar10 = View<int,_true,_std::allocator<unsigned_long>_>::shape(expression->e_,uVar18);
          if (sVar9 != sVar10) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Assertion failed.");
            goto LAB_00210c9d;
          }
          uVar18 = uVar18 + 1;
        } while (v->data_ != (pointer)0x0);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"Assertion failed.");
      }
    }
    else {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"Assertion failed.");
    }
  }
LAB_00210c9d:
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void operate
(
    View<T1, false, A>& v, 
    const ViewExpression<E, T2>& expression, 
    Functor f
)
{
    const E& e = expression; // cast
    if(!MARRAY_NO_DEBUG) {
        Assert(v.size() != 0 && e.size() != 0);
        Assert(e.dimension() == v.dimension());
        if(v.dimension() == 0) {
            Assert(v.size() == 1 && e.size() == 1);
        }
        else {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == e.shape(j));
            }
        }
    }
    if(e.overlaps(v)) {
        Marray<T1, A> m(e); // temporary copy
        operate(v, m, f);
    }
    else if(v.dimension() == 0) {
        f(v[0], e[0]);
    }
    else if(v.isSimple() && e.isSimple() 
    && v.coordinateOrder() == e.coordinateOrder()) {
        for(std::size_t j=0; j<v.size(); ++j) {
            f(v[j], e[j]);
        }
    }
    else {
        // loop unrolling does not improve performance here
        typename E::ExpressionIterator itE(e);
        std::size_t offsetV = 0;
        std::vector<std::size_t> coordinate(v.dimension());
        std::size_t maxDimension = v.dimension() - 1;
        for(;;) {
            f(v[offsetV], *itE);
            for(std::size_t j=0; j<v.dimension(); ++j) {
                if(coordinate[j]+1 == v.shape(j)) {
                    if(j == maxDimension) {
                        return;
                    }
                    else {
                        offsetV -= coordinate[j] * v.strides(j);
                        itE.resetCoordinate(j);
                        coordinate[j] = 0;
                    }
                }
                else {
                    offsetV += v.strides(j);
                    itE.incrementCoordinate(j);
                    ++coordinate[j];
                    break;
                }
            }
        }
    }
}